

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

int Ifn_NtkAddClauses(Ifn_Ntk_t *p,int *pValues,sat_solver *pSat)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  sbyte sVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  lit *end;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  int *local_e0;
  int pLits [13];
  int pLits2 [13];
  
  iVar2 = sat_solver_nvars(pSat);
  uVar6 = 0;
  uVar9 = (ulong)(uint)p->nObjs;
  if (p->nObjs < 1) {
    uVar9 = uVar6;
  }
  iVar10 = iVar2 << 0x10;
  for (; uVar9 * 0x30 - uVar6 != 0; uVar6 = uVar6 + 0x30) {
    iVar2 = iVar2 + 1;
    *(uint *)((long)p->Nodes[0].Fanins + (uVar6 - 4)) =
         (uint)*(ushort *)((long)p->Nodes[0].Fanins + (uVar6 - 4)) + iVar10;
    iVar10 = iVar10 + 0x10000;
  }
  sat_solver_setnvars(pSat,iVar2);
  uVar11 = p->nVars;
  lVar4 = (long)(int)uVar11;
  uVar9 = 0;
  uVar6 = 0;
  if (0 < (int)uVar11) {
    uVar6 = (ulong)uVar11;
  }
  while (uVar6 != uVar9) {
    piVar1 = pValues + uVar9;
    uVar9 = uVar9 + 1;
    if (*piVar1 == -1) {
      __assert_fail("pValues[i] != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                    ,0x462,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
    }
  }
  while (lVar4 < (long)p->nObjs + -1) {
    piVar1 = pValues + lVar4;
    lVar4 = lVar4 + 1;
    if (*piVar1 != -1) {
      __assert_fail("pValues[i] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                    ,0x464,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
    }
  }
  if (pValues[(long)p->nObjs + -1] == -1) {
    __assert_fail("pValues[p->nObjs-1] != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                  ,0x465,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
  }
  for (lVar4 = 0; lVar8 = (long)p->nInps, lVar4 < lVar8; lVar4 = lVar4 + 1) {
    iVar2 = p->nParsVNum;
    iVar10 = p->nParsVIni;
    lVar8 = 0;
    while (lVar8 < p->nVars) {
      pLits[0] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[lVar4].field_0x2,(uint)(pValues[lVar8] == 0)
                            );
      for (lVar15 = 0; lVar15 < p->nParsVNum; lVar15 = lVar15 + 1) {
        iVar3 = Abc_Var2Lit((uint)lVar15 + iVar2 * (int)lVar4 + iVar10,
                            (uint)(((uint)lVar8 >> ((uint)lVar15 & 0x1f) & 1) != 0));
        pLits[lVar15 + 1] = iVar3;
      }
      iVar3 = sat_solver_addclause(pSat,pLits,pLits + (long)p->nParsVNum + 1);
      lVar8 = lVar8 + 1;
      if (iVar3 == 0) {
        return 0;
      }
    }
  }
  local_e0 = p->Nodes[lVar8].Fanins;
  do {
    lVar4 = (long)p->nObjs;
    if (lVar4 <= lVar8) {
      pLits[0] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[lVar4 + -1].field_0x2,
                             (uint)(pValues[lVar4 + -1] == 0));
      iVar2 = sat_solver_addclause(pSat,pLits,pLits + 1);
      return (uint)(iVar2 != 0);
    }
    uVar11 = *(uint *)(p->Nodes + lVar8);
    if (3 < (uVar11 & 7) - 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                    ,0x4d7,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
    }
    uVar12 = uVar11 >> 3 & 0x1f;
    sVar5 = (sbyte)uVar12;
    switch(uVar11 & 7) {
    case 3:
      pLits[0] = Abc_Var2Lit(uVar11 >> 0x10,0);
      end = pLits;
      for (uVar9 = 0; end = end + 1, uVar12 != uVar9; uVar9 = uVar9 + 1) {
        iVar2 = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[local_e0[uVar9]].field_0x2,1);
        *end = iVar2;
        pLits2[0] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[lVar8].field_0x2,1);
        pLits2[1] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[local_e0[uVar9]].field_0x2,0);
        iVar2 = sat_solver_addclause(pSat,pLits2,pLits2 + 2);
        if (iVar2 == 0) {
          return 0;
        }
      }
      iVar2 = sat_solver_addclause(pSat,pLits,end);
      if (iVar2 == 0) {
        return 0;
      }
      break;
    case 4:
      uVar7 = 0;
      uVar11 = 2 << sVar5;
      if (2 << sVar5 < 1) {
        uVar11 = uVar7;
      }
      for (; uVar7 != uVar11; uVar7 = uVar7 + 1) {
        uVar14 = 0;
        for (iVar2 = 0; uVar12 + 1 != iVar2; iVar2 = iVar2 + 1) {
          uVar14 = uVar14 + (uVar7 >> ((byte)iVar2 & 0x1f));
        }
        if ((uVar14 & 1) != 0) {
          pLits[0] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[lVar8].field_0x2,
                                 (uint)((uVar7 >> uVar12 & 1) != 0));
          for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
            iVar2 = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[local_e0[uVar9]].field_0x2,
                                (uint)((uVar7 >> ((uint)uVar9 & 0x1f) & 1) != 0));
            pLits[uVar9 + 1] = iVar2;
          }
          iVar2 = sat_solver_addclause(pSat,pLits,pLits + (ulong)uVar12 + 1);
          if (iVar2 == 0) {
            return 0;
          }
        }
      }
      break;
    case 5:
      pLits[0] = Abc_Var2Lit(uVar11 >> 0x10,0);
      pLits[1] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[p->Nodes[lVar8].Fanins[0]].field_0x2,1);
      pLits[2] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[p->Nodes[lVar8].Fanins[1]].field_0x2,1);
      iVar2 = sat_solver_addclause(pSat,pLits,pLits + 3);
      if (iVar2 == 0) {
        return 0;
      }
      pLits[0] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[lVar8].field_0x2,1);
      pLits[1] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[p->Nodes[lVar8].Fanins[0]].field_0x2,1);
      pLits[2] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[p->Nodes[lVar8].Fanins[1]].field_0x2,0);
      iVar2 = sat_solver_addclause(pSat,pLits,pLits + 3);
      if (iVar2 == 0) {
        return 0;
      }
      pLits[0] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[lVar8].field_0x2,0);
      pLits[1] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[p->Nodes[lVar8].Fanins[0]].field_0x2,0);
      pLits[2] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[p->Nodes[lVar8].Fanins[2]].field_0x2,1);
      iVar2 = sat_solver_addclause(pSat,pLits,pLits + 3);
      if (iVar2 == 0) {
        return 0;
      }
      pLits[0] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[lVar8].field_0x2,1);
      pLits[1] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[p->Nodes[lVar8].Fanins[0]].field_0x2,0);
      pLits[2] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[p->Nodes[lVar8].Fanins[2]].field_0x2,0);
      iVar2 = sat_solver_addclause(pSat,pLits,pLits + 3);
      if (iVar2 == 0) {
        return 0;
      }
      break;
    case 6:
      uVar7 = 1 << sVar5;
      uVar14 = 0;
      if (1 << sVar5 < 1) {
        uVar7 = 0;
      }
      for (; uVar14 != uVar7; uVar14 = uVar14 + 1) {
        bVar16 = pValues[lVar8] == -1;
        if (bVar16) {
          pLits[0] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[lVar8].field_0x2,0);
          pLits2[0] = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[lVar8].field_0x2,1);
        }
        uVar13 = 0;
        for (uVar9 = 0; uVar12 << 2 != uVar9; uVar9 = uVar9 + 4) {
          iVar2 = Abc_Var2Lit((uint)*(ushort *)&p->Nodes[*(int *)((long)local_e0 + uVar9)].field_0x2
                              ,(uint)((uVar14 >> (uVar13 & 0x1f) & 1) != 0));
          *(int *)((long)pLits2 + uVar9 + (uint)bVar16 * 4) = iVar2;
          *(int *)((long)pLits + uVar9 + (uint)bVar16 * 4) = iVar2;
          uVar13 = uVar13 + 1;
        }
        iVar10 = uVar14 + (uVar11 >> 8 & 0xff);
        iVar2 = Abc_Var2Lit(iVar10,1);
        *(int *)((long)pLits + uVar9 + (uint)bVar16 * 4) = iVar2;
        iVar2 = Abc_Var2Lit(iVar10,0);
        *(int *)((long)pLits2 + uVar9 + (uint)bVar16 * 4) = iVar2;
        if (pValues[lVar8] == 0) {
LAB_0039da08:
          iVar2 = sat_solver_addclause
                            (pSat,pLits,(lit *)((long)pLits + uVar9 + (ulong)bVar16 * 4 + 4));
          if (iVar2 == 0) {
            return 0;
          }
        }
        else {
          iVar2 = sat_solver_addclause
                            (pSat,pLits2,(lit *)((long)pLits2 + uVar9 + (ulong)bVar16 * 4 + 4));
          if (iVar2 == 0) {
            return 0;
          }
          if (pValues[lVar8] != 1) goto LAB_0039da08;
        }
      }
    }
    lVar8 = lVar8 + 1;
    local_e0 = local_e0 + 0xc;
  } while( true );
}

Assistant:

int Ifn_NtkAddClauses( Ifn_Ntk_t * p, int * pValues, sat_solver * pSat )
{
    int i, f, v, nLits, pLits[IFN_INS+2], pLits2[IFN_INS+2];
    // assign new variables
    int nSatVars = sat_solver_nvars(pSat);
//    for ( i = 0; i < p->nObjs-1; i++ )
    for ( i = 0; i < p->nObjs; i++ )
        p->Nodes[i].Var = nSatVars++;
    //p->Nodes[p->nObjs-1].Var = 0xFFFF;
    sat_solver_setnvars( pSat, nSatVars );
    // verify variable values
    for ( i = 0; i < p->nVars; i++ )
        assert( pValues[i] != -1 );
    for ( i = p->nVars; i < p->nObjs-1; i++ )
        assert( pValues[i] == -1 );
    assert( pValues[p->nObjs-1] != -1 );
    // internal variables
//printf( "\n" );
    for ( i = 0; i < p->nInps; i++ )
    {
        int iParStart = p->nParsVIni + i * p->nParsVNum;
        for ( v = 0; v < p->nVars; v++ )
        {
            // add output literal
            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, pValues[v]==0 );
            // add clause literals
            for ( f = 0; f < p->nParsVNum; f++ )
                pLits[f+1] = Abc_Var2Lit( iParStart + f, (v >> f) & 1 ); 
            if ( !Ifn_AddClause( pSat, pLits, pLits+p->nParsVNum+1 ) )
                return 0;
        }
    }
//printf( "\n" );
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        if ( p->Nodes[i].Type == IFN_DSD_AND )
        {
            nLits = 0;
            pLits[nLits++] = Abc_Var2Lit( p->Nodes[i].Var, 0 );
            for ( f = 0; f < nFans; f++ )
            {
                pLits[nLits++] = Abc_Var2Lit( p->Nodes[pFans[f]].Var, 1 );
                // add small clause
                pLits2[0] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
                pLits2[1] = Abc_Var2Lit( p->Nodes[pFans[f]].Var, 0 );
                if ( !Ifn_AddClause( pSat, pLits2, pLits2 + 2 ) )
                    return 0;
            }
            // add big clause
            if ( !Ifn_AddClause( pSat, pLits, pLits + nLits ) )
                return 0;
        }
        else if ( p->Nodes[i].Type == IFN_DSD_XOR )
        {
            int m, nMints = (1 << (nFans+1));
            for ( m = 0; m < nMints; m++ )
            {
                // skip even 
                int Count = 0;
                for ( v = 0; v <= nFans; v++ )
                    Count += ((m >> v) & 1);
                if ( (Count & 1) == 0 )
                    continue;
                // generate minterm
                pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, (m >> nFans) & 1 );
                for ( v = 0; v < nFans; v++ )
                    pLits[v+1] = Abc_Var2Lit( p->Nodes[pFans[v]].Var, (m >> v) & 1 );
                if ( !Ifn_AddClause( pSat, pLits, pLits + nFans + 1 ) )
                    return 0;
            }
        }
        else if ( p->Nodes[i].Type == IFN_DSD_MUX )
        {
            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 0 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 1 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[1]].Var, 1 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;

            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 1 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[1]].Var, 0 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;

            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 0 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 0 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[2]].Var, 1 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;

            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 0 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[2]].Var, 0 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;
        }
        else if ( p->Nodes[i].Type == IFN_DSD_PRIME )
        {
            int nValues = (1 << nFans);
            int iParStart = p->Nodes[i].iFirst;
            for ( v = 0; v < nValues; v++ )
            {
                nLits = 0;
                if ( pValues[i] == -1 )
                {
                    pLits[nLits]  = Abc_Var2Lit( p->Nodes[i].Var, 0 );
                    pLits2[nLits] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
                    nLits++;
                }
                for ( f = 0; f < nFans; f++, nLits++ )
                    pLits[nLits] = pLits2[nLits] = Abc_Var2Lit( p->Nodes[pFans[f]].Var, (v >> f) & 1 ); 
                pLits[nLits]  = Abc_Var2Lit( iParStart + v, 1 ); 
                pLits2[nLits] = Abc_Var2Lit( iParStart + v, 0 ); 
                nLits++;
                if ( pValues[i] != 0 )
                {
                    if ( !Ifn_AddClause( pSat, pLits2, pLits2 + nLits ) )
                        return 0;
                }
                if ( pValues[i] != 1 )
                {
                    if ( !Ifn_AddClause( pSat, pLits,  pLits + nLits ) )
                        return 0;
                }
            }
        }
        else assert( 0 );
//printf( "\n" );
    }
    // add last clause (not needed if the root node is IFN_DSD_PRIME)
    pLits[0] = Abc_Var2Lit( p->Nodes[p->nObjs-1].Var, pValues[p->nObjs-1]==0 );
    if ( !Ifn_AddClause( pSat, pLits,  pLits + 1 ) )
        return 0;
    return 1;
}